

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_states.hpp
# Opt level: O2

void __thiscall
duckdb::MultiFileLocalState::MultiFileLocalState(MultiFileLocalState *this,ClientContext *context)

{
  (this->super_LocalTableFunctionState)._vptr_LocalTableFunctionState =
       (_func_int **)&PTR__MultiFileLocalState_01798498;
  (this->reader_data).ptr = (MultiFileReaderData *)0x0;
  (this->reader).internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->reader).internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->file_index = 0xffffffffffffffff;
  (this->local_state).
  super_unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalTableFunctionState_*,_std::default_delete<duckdb::LocalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false>._M_head_impl =
       (LocalTableFunctionState *)0x0;
  DataChunk::DataChunk(&this->scan_chunk);
  ExpressionExecutor::ExpressionExecutor(&this->executor,context);
  return;
}

Assistant:

explicit MultiFileLocalState(ClientContext &context) : executor(context) {
	}